

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

_Bool realloc_tensor(TENSOR *tensor,int channels,int width,int height)

{
  float *pfVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = height * width;
  iVar4 = iVar3 * channels;
  if (tensor->allocsize < iVar4) {
    if (tensor->allocsize != 0) {
      aom_free(tensor->buf[0]);
      tensor->buf[0] = (float *)0x0;
      tensor->allocsize = 0;
    }
    pfVar1 = (float *)aom_malloc((long)iVar4 << 2);
    tensor->buf[0] = pfVar1;
    if (pfVar1 == (float *)0x0) {
      return false;
    }
    tensor->allocsize = iVar4;
  }
  tensor->width = width;
  tensor->height = height;
  tensor->stride = width;
  tensor->channels = channels;
  if (1 < channels) {
    pfVar1 = tensor->buf[0];
    lVar2 = 0;
    iVar4 = iVar3;
    do {
      tensor->buf[lVar2 + 1] = pfVar1 + iVar4;
      lVar2 = lVar2 + 1;
      iVar4 = iVar4 + iVar3;
    } while ((ulong)(uint)channels - 1 != lVar2);
  }
  return true;
}

Assistant:

static bool realloc_tensor(TENSOR *tensor, int channels, int width,
                           int height) {
  const int newallocsize = channels * width * height;
  if (tensor->allocsize < newallocsize) {
    free_tensor(tensor);
    tensor->buf[0] =
        (float *)aom_malloc(sizeof(*tensor->buf[0]) * newallocsize);
    if (!tensor->buf[0]) return false;
    tensor->allocsize = newallocsize;
  }
  tensor->width = width;
  tensor->height = height;
  tensor->stride = width;
  tensor->channels = channels;
  for (int c = 1; c < channels; ++c)
    tensor->buf[c] = &tensor->buf[0][c * width * height];
  return true;
}